

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_lookupMacroSelector
          (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t found;
  sysbvm_tuple_t local_20;
  
  if ((type & 0xf) == 0 && type != 0) {
    if ((*(byte *)(type + 8) & 0x80) == 0) {
      sVar2 = *(sysbvm_tuple_t *)(type + 0x88);
    }
    else {
      sVar2 = 0;
    }
    if (sVar2 != 0) {
      local_20 = 0;
      _Var1 = sysbvm_methodDictionary_find(sVar2,selector,&local_20);
      if (_Var1) {
        return local_20;
      }
    }
    if ((*(byte *)(type + 8) & 0x80) == 0) {
      sVar2 = *(sysbvm_tuple_t *)(type + 0x30);
    }
    else {
      sVar2 = 0;
    }
    sVar2 = sysbvm_type_lookupMacroSelector(context,sVar2,selector);
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_lookupMacroSelector(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t methodDictionary = sysbvm_type_getMacroMethodDictionary(type);
    if(methodDictionary)
    {
        sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
        if(sysbvm_methodDictionary_find(methodDictionary, selector, &found))
            return found;
    }

    return sysbvm_type_lookupMacroSelector(context, sysbvm_type_getSupertype(type), selector);
}